

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::constrainedfacets(tetgenmesh *this)

{
  tetrahedron *pppdVar1;
  uint *puVar2;
  uint uVar3;
  char *pcVar4;
  shellface ppdVar5;
  bool bVar6;
  interresult iVar7;
  int iVar8;
  arraypool *paVar9;
  arraypool *this_00;
  arraypool *this_01;
  arraypool *paVar10;
  arraypool *this_02;
  arraypool *this_03;
  arraypool *this_04;
  arraypool *paVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  face *pfVar19;
  face *searchsh_00;
  bool bVar20;
  arraypool *paVar21;
  face *parysh1;
  arraypool *local_e0;
  arraypool *local_d8;
  arraypool *local_d0;
  arraypool *local_c8;
  arraypool *local_c0;
  arraypool *local_b8;
  arraypool *local_b0;
  long local_a8;
  face *local_a0;
  face searchsh;
  triface searchtet;
  triface local_60;
  face *local_50;
  arraypool *local_48;
  triface crossedge;
  
  searchtet.tet = (tetrahedron *)0x0;
  searchtet.ver = 0;
  local_60.tet = (tetrahedron *)0x0;
  local_60.ver = 0;
  crossedge.tet = (tetrahedron *)0x0;
  crossedge.ver = 0;
  searchsh.sh = (shellface *)0x0;
  searchsh.shver = 0;
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 0x10;
  paVar9->objectsperblock = 0x400;
  paVar9->log2objectsperblock = 10;
  paVar9->objectsperblockmark = 0x3ff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  local_d0 = (arraypool *)operator_new(0x30);
  local_d0->objectbytes = 0x10;
  local_d0->objectsperblock = 0x400;
  local_d0->log2objectsperblock = 10;
  local_d0->objectsperblockmark = 0x3ff;
  local_d0->toparraylen = 0;
  local_d0->toparray = (char **)0x0;
  local_d0->objects = 0;
  local_d0->totalmemory = 0;
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 0x10;
  this_00->objectsperblock = 0x400;
  this_00->log2objectsperblock = 10;
  this_00->objectsperblockmark = 0x3ff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  local_d8 = (arraypool *)operator_new(0x30);
  local_d8->objectbytes = 0x10;
  local_d8->objectsperblock = 0x400;
  local_d8->log2objectsperblock = 10;
  local_d8->objectsperblockmark = 0x3ff;
  local_d8->toparraylen = 0;
  local_d8->toparray = (char **)0x0;
  local_d8->objects = 0;
  local_d8->totalmemory = 0;
  local_b8 = (arraypool *)operator_new(0x30);
  local_b8->objectbytes = 0x10;
  local_b8->objectsperblock = 0x400;
  local_b8->log2objectsperblock = 10;
  local_b8->objectsperblockmark = 0x3ff;
  local_b8->toparraylen = 0;
  local_b8->toparray = (char **)0x0;
  local_b8->objects = 0;
  local_b8->totalmemory = 0;
  local_c0 = (arraypool *)operator_new(0x30);
  local_c0->objectbytes = 0x10;
  local_c0->objectsperblock = 0x400;
  local_c0->log2objectsperblock = 10;
  local_c0->objectsperblockmark = 0x3ff;
  local_c0->toparraylen = 0;
  local_c0->toparray = (char **)0x0;
  local_c0->objects = 0;
  local_c0->totalmemory = 0;
  this_01 = (arraypool *)operator_new(0x30);
  this_01->objectbytes = 8;
  this_01->objectsperblock = 0x100;
  this_01->log2objectsperblock = 8;
  this_01->objectsperblockmark = 0xff;
  this_01->toparraylen = 0;
  this_01->toparray = (char **)0x0;
  this_01->objects = 0;
  this_01->totalmemory = 0;
  local_e0 = (arraypool *)operator_new(0x30);
  local_e0->objectbytes = 8;
  local_e0->objectsperblock = 0x100;
  local_e0->log2objectsperblock = 8;
  local_e0->objectsperblockmark = 0xff;
  local_e0->toparraylen = 0;
  local_e0->toparray = (char **)0x0;
  local_e0->objects = 0;
  local_e0->totalmemory = 0;
  paVar10 = (arraypool *)operator_new(0x30);
  paVar10->objectbytes = 0x10;
  paVar10->objectsperblock = 0x400;
  paVar10->log2objectsperblock = 10;
  paVar10->objectsperblockmark = 0x3ff;
  paVar10->toparraylen = 0;
  paVar10->toparray = (char **)0x0;
  paVar10->objects = 0;
  paVar10->totalmemory = 0;
  local_c8 = (arraypool *)operator_new(0x30);
  local_c8->objectbytes = 0x10;
  local_c8->objectsperblock = 0x400;
  local_c8->log2objectsperblock = 10;
  local_c8->objectsperblockmark = 0x3ff;
  local_c8->toparraylen = 0;
  local_c8->toparray = (char **)0x0;
  local_c8->objects = 0;
  local_c8->totalmemory = 0;
  this_02 = (arraypool *)operator_new(0x30);
  this_02->objectbytes = 0x10;
  this_02->objectsperblock = 0x400;
  this_02->log2objectsperblock = 10;
  this_02->objectsperblockmark = 0x3ff;
  this_02->toparraylen = 0;
  this_02->toparray = (char **)0x0;
  this_02->objects = 0;
  this_02->totalmemory = 0;
  this_03 = (arraypool *)operator_new(0x30);
  this_03->objectbytes = 0x10;
  this_03->objectsperblock = 0x400;
  this_03->log2objectsperblock = 10;
  this_03->objectsperblockmark = 0x3ff;
  this_03->toparraylen = 0;
  this_03->toparray = (char **)0x0;
  this_03->objects = 0;
  this_03->totalmemory = 0;
  local_b0 = (arraypool *)operator_new(0x30);
  local_b0->objectbytes = 0x10;
  local_b0->objectsperblock = 0x400;
  local_b0->log2objectsperblock = 10;
  local_b0->objectsperblockmark = 0x3ff;
  local_b0->toparraylen = 0;
  local_b0->toparray = (char **)0x0;
  local_b0->objects = 0;
  local_b0->totalmemory = 0;
  this_04 = (arraypool *)operator_new(0x30);
  this_04->objectbytes = 8;
  this_04->objectsperblock = 0x100;
  this_04->log2objectsperblock = 8;
  this_04->objectsperblockmark = 0xff;
  this_04->toparraylen = 0;
  this_04->toparray = (char **)0x0;
  this_04->objects = 0;
  this_04->totalmemory = 0;
  paVar11 = (arraypool *)operator_new(0x30);
  paVar11->objectbytes = 0x10;
  paVar11->objectsperblock = 0x10;
  paVar11->log2objectsperblock = 4;
  paVar11->objectsperblockmark = 0xf;
  paVar11->toparraylen = 0;
  paVar11->totalmemory = 0;
  paVar11->toparray = (char **)0x0;
  paVar11->objects = 0;
  this->encseglist = paVar11;
  local_50 = &this->recentsh;
  iVar8 = 0;
  do {
    paVar21 = local_d0;
    paVar11 = this->subfacstack;
    uVar14 = paVar11->objects;
    do {
      if ((long)uVar14 < 1) {
        this->totalworkmemory =
             this->totalworkmemory +
             local_d0->totalmemory + paVar9->totalmemory + this_00->totalmemory +
             local_d8->totalmemory + local_b8->totalmemory + local_c0->totalmemory +
             this_01->totalmemory + local_e0->totalmemory + paVar10->totalmemory +
             local_c8->totalmemory + this_02->totalmemory + this_03->totalmemory +
             local_b0->totalmemory + this_04->totalmemory + this->encseglist->totalmemory;
        arraypool::~arraypool(paVar9);
        operator_delete(paVar9,0x30);
        arraypool::~arraypool(paVar21);
        operator_delete(paVar21,0x30);
        arraypool::~arraypool(this_00);
        operator_delete(this_00,0x30);
        paVar9 = local_d8;
        arraypool::~arraypool(local_d8);
        operator_delete(paVar9,0x30);
        paVar9 = local_b8;
        arraypool::~arraypool(local_b8);
        operator_delete(paVar9,0x30);
        paVar9 = local_c0;
        arraypool::~arraypool(local_c0);
        operator_delete(paVar9,0x30);
        arraypool::~arraypool(this_01);
        operator_delete(this_01,0x30);
        paVar9 = local_e0;
        arraypool::~arraypool(local_e0);
        operator_delete(paVar9,0x30);
        arraypool::~arraypool(paVar10);
        operator_delete(paVar10,0x30);
        paVar10 = local_c8;
        arraypool::~arraypool(local_c8);
        operator_delete(paVar10,0x30);
        arraypool::~arraypool(this_02);
        operator_delete(this_02,0x30);
        arraypool::~arraypool(this_03);
        operator_delete(this_03,0x30);
        paVar10 = local_b0;
        arraypool::~arraypool(local_b0);
        operator_delete(paVar10,0x30);
        arraypool::~arraypool(this_04);
        operator_delete(this_04,0x30);
        paVar10 = this->encseglist;
        if (paVar10 != (arraypool *)0x0) {
          arraypool::~arraypool(paVar10);
        }
        operator_delete(paVar10,0x30);
        this->encseglist = (arraypool *)0x0;
        return;
      }
      uVar14 = uVar14 - 1;
      paVar11->objects = uVar14;
      pcVar4 = paVar11->toparray[uVar14 >> ((byte)paVar11->log2objectsperblock & 0x3f)];
      lVar17 = (long)paVar11->objectbytes * ((long)paVar11->objectsperblockmark & uVar14);
      searchsh.sh = *(shellface **)(pcVar4 + lVar17);
      searchsh.shver = *(int *)(pcVar4 + lVar17 + 8);
    } while ((searchsh.sh[3] == (shellface)0x0) ||
            (searchsh.sh[(ulong)(searchsh.shver & 1) + 9] != (shellface)0x0));
    local_a0 = (face *)(pcVar4 + lVar17);
    puVar2 = (uint *)((long)searchsh.sh + (long)this->shmarkindex * 4 + 4);
    *puVar2 = *puVar2 | 2;
    arraypool::newindex(paVar10,&local_a0);
    local_a0->sh = searchsh.sh;
    local_a0->shver = searchsh.shver;
    pfVar19 = local_a0;
    for (lVar17 = 0; lVar13 = paVar10->objects, lVar17 < lVar13; lVar17 = lVar17 + 1) {
      pfVar19 = (face *)(paVar10->toparray
                         [(uint)lVar17 >> ((byte)paVar10->log2objectsperblock & 0x1f)] +
                        (long)paVar10->objectbytes *
                        (long)(int)(paVar10->objectsperblockmark & (uint)lVar17));
      iVar18 = 3;
      while (bVar20 = iVar18 != 0, iVar18 = iVar18 + -1, bVar20) {
        lVar13 = (long)(pfVar19->shver >> 1);
        if (pfVar19->sh[lVar13 + 6] == (shellface)0x0) {
          ppdVar5 = pfVar19->sh[lVar13];
          uVar12 = (uint)ppdVar5;
          searchsh.shver = uVar12 & 7;
          searchsh.sh = (shellface *)((ulong)ppdVar5 & 0xfffffffffffffff8);
          uVar3 = *(uint *)((long)searchsh.sh + (long)this->shmarkindex * 4 + 4);
          if (((uVar3 & 2) == 0) && (searchsh.sh[(ulong)(uVar12 & 1) + 9] == (shellface)0x0)) {
            *(uint *)((long)searchsh.sh + (long)this->shmarkindex * 4 + 4) = uVar3 | 2;
            arraypool::newindex(paVar10,&parysh1);
            parysh1->sh = searchsh.sh;
            parysh1->shver = searchsh.shver;
          }
        }
        pfVar19->shver = snextpivot[pfVar19->shver];
      }
    }
    lVar17 = 0;
    if (0 < lVar13) {
      lVar17 = lVar13;
    }
    searchsh_00 = pfVar19;
    for (lVar15 = 0; lVar17 != lVar15; lVar15 = lVar15 + 1) {
      lVar16 = (long)paVar10->objectbytes * (long)(int)(paVar10->objectsperblockmark & (uint)lVar15)
      ;
      searchsh_00 = (face *)(paVar10->toparray
                             [(uint)lVar15 >> ((byte)paVar10->log2objectsperblock & 0x1f)] + lVar16)
      ;
      puVar2 = (uint *)(*(long *)(paVar10->toparray
                                  [(uint)lVar15 >> ((byte)paVar10->log2objectsperblock & 0x1f)] +
                                 lVar16) + 4 + (long)this->shmarkindex * 4);
      *puVar2 = *puVar2 & 0xfffffffd;
    }
    local_a0 = pfVar19;
    if (1 < this->b->verbose) {
      printf("    Recovering facet #%d: %ld subfaces.\n",(ulong)(iVar8 + 1),lVar13);
    }
    while (0 < lVar13) {
      uVar14 = lVar13 - 1;
      paVar10->objects = uVar14;
      pcVar4 = paVar10->toparray[uVar14 >> ((byte)paVar10->log2objectsperblock & 0x3f)];
      lVar17 = (long)paVar10->objectbytes * ((long)paVar10->objectsperblockmark & uVar14);
      searchsh_00 = (face *)(pcVar4 + lVar17);
      searchsh.sh = *(shellface **)(pcVar4 + lVar17);
      searchsh.shver = *(int *)(pcVar4 + lVar17 + 8);
      if ((searchsh.sh[3] != (shellface)0x0) &&
         (searchsh.sh[(ulong)(searchsh.shver & 1) + 9] == (shellface)0x0)) {
        searchtet.tet = (tetrahedron *)0x0;
        iVar18 = scoutsubface(this,&searchsh,&searchtet,1);
        paVar11 = local_b0;
        if (iVar18 == 0) {
          formregion(this,&searchsh,this_03,local_b0,this_04);
          iVar18 = scoutcrossedge(this,&searchtet,paVar11,this_03);
          if (iVar18 == 0) {
            local_a8 = this_03->objects;
            for (lVar17 = 0; lVar17 < local_a8; lVar17 = lVar17 + 1) {
              pcVar4 = this_03->toparray
                       [(uint)lVar17 >> ((byte)this_03->log2objectsperblock & 0x1f)];
              lVar13 = (long)this_03->objectbytes *
                       (long)(int)(this_03->objectsperblockmark & (uint)lVar17);
              searchsh_00 = (face *)(pcVar4 + lVar13);
              arraypool::newindex(paVar10,&parysh1);
              parysh1->sh = *(shellface **)(pcVar4 + lVar13);
              parysh1->shver = *(int *)(pcVar4 + lVar13 + 8);
            }
            bVar20 = false;
          }
          else {
            crossedge.tet = searchtet.tet;
            crossedge.ver = searchtet.ver;
            paVar21 = this_01;
            bVar6 = formcavity(this,&searchtet,this_03,paVar9,local_d8,local_b8,this_01,local_e0);
            paVar11 = local_c0;
            bVar20 = true;
            if (bVar6) {
              if (this->b->flipinsert == 0) {
                delaunizecavity(this,this_01,local_d8,local_c8,local_d0,paVar9,local_c0);
                delaunizecavity(this,local_e0,local_b8,this_02,this_00,paVar9,paVar11);
                paVar11 = local_d0;
                paVar21 = this_00;
                bVar6 = fillcavity(this,local_c8,this_02,local_c0,this_03,local_d0,this_00,
                                   &crossedge);
                if (!bVar6) {
                  restorecavity(this,paVar9,paVar11,this_00,local_b0);
                  goto LAB_00133ca7;
                }
                carvecavity(this,paVar9,paVar11,this_00);
              }
              else {
                flipinsertfacet(this,paVar9,this_01,local_e0,this_04);
                local_a8 = this_03->objects;
                for (lVar17 = 0; lVar17 < local_a8; lVar17 = lVar17 + 1) {
                  pcVar4 = this_03->toparray
                           [(uint)lVar17 >> ((byte)this_03->log2objectsperblock & 0x1f)];
                  lVar13 = (long)this_03->objectbytes *
                           (long)(int)(this_03->objectsperblockmark & (uint)lVar17);
                  searchsh_00 = (face *)(pcVar4 + lVar13);
                  arraypool::newindex(paVar10,&parysh1);
                  parysh1->sh = *(shellface **)(pcVar4 + lVar13);
                  parysh1->shver = *(int *)(pcVar4 + lVar13 + 8);
                }
                paVar9->objects = 0;
                local_d8->objects = 0;
                local_b8->objects = 0;
                this_01->objects = 0;
                local_e0->objects = 0;
              }
              for (lVar17 = 0; paVar11 = this->caveencshlist, lVar17 < paVar11->objects;
                  lVar17 = lVar17 + 1) {
                searchsh_00 = (face *)(paVar11->toparray
                                       [(uint)lVar17 >> ((byte)paVar11->log2objectsperblock & 0x1f)]
                                      + (long)paVar11->objectbytes *
                                        (long)(int)(paVar11->objectsperblockmark & (uint)lVar17));
                iVar18 = scoutsubface(this,searchsh_00,&searchtet,1);
                if (iVar18 == 0) {
                  arraypool::newindex(paVar10,&parysh1);
                  parysh1->sh = searchsh_00->sh;
                  parysh1->shver = searchsh_00->shver;
                }
              }
              paVar11->objects = 0;
              lVar17 = 0;
              local_48 = paVar10;
              while( true ) {
                paVar10 = this->caveencseglist;
                if (paVar10->objects <= lVar17) break;
                pcVar4 = paVar10->toparray
                         [(uint)lVar17 >> ((byte)paVar10->log2objectsperblock & 0x1f)];
                lVar13 = (long)paVar10->objectbytes *
                         (long)(int)(paVar10->objectsperblockmark & (uint)lVar17);
                pfVar19 = (face *)(pcVar4 + lVar13);
                local_a8 = lVar17;
                iVar7 = scoutsegment(this,*(point *)(*(long *)(pcVar4 + lVar13) +
                                                    (long)sorgpivot[*(int *)(pcVar4 + lVar13 + 8)] *
                                                    8),
                                     *(point *)(*(long *)(pcVar4 + lVar13) +
                                               (long)sdestpivot[*(int *)(pcVar4 + lVar13 + 8)] * 8),
                                     pfVar19,&searchtet,(point *)0x0,paVar21);
                if (iVar7 != SHAREEDGE) {
                  terminatetetgen(this,2);
                }
                pfVar19->sh[9] = (shellface)((long)searchtet.ver | (ulong)searchtet.tet);
                local_60.tet = searchtet.tet;
                local_60.ver = searchtet.ver;
                do {
                  tssbond1(this,&local_60,pfVar19);
                  pppdVar1 = local_60.tet + facepivot1[local_60.ver];
                  local_60.tet = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
                  local_60.ver = facepivot2[local_60.ver][(uint)*pppdVar1 & 0xf];
                } while (searchtet.tet != local_60.tet);
                lVar17 = local_a8 + 1;
              }
              paVar10->objects = 0;
              bVar20 = false;
              paVar10 = local_48;
            }
          }
LAB_00133ca7:
          lVar17 = this_04->objects;
          if (lVar17 < 1) {
            lVar17 = 0;
          }
          for (lVar13 = 0; lVar17 != lVar13; lVar13 = lVar13 + 1) {
            puVar2 = (uint *)(*(long *)(this_04->toparray
                                        [(uint)lVar13 >> ((byte)this_04->log2objectsperblock & 0x1f)
                                        ] + (long)this_04->objectbytes *
                                            (long)(int)(this_04->objectsperblockmark & (uint)lVar13)
                                       ) + 4 + (long)this->pointmarkindex * 4);
            *puVar2 = *puVar2 & 0xfffffffd;
          }
          this_04->objects = 0;
          local_b0->objects = 0;
          this_03->objects = 0;
          if (bVar20) {
            refineregion(this,local_50,this_01,local_d8,local_c8,local_d0,paVar9,local_c0);
          }
        }
      }
      lVar13 = paVar10->objects;
    }
    iVar8 = iVar8 + 1;
    local_a0 = searchsh_00;
  } while( true );
}

Assistant:

void tetgenmesh::constrainedfacets()
{
  arraypool *tg_crosstets, *tg_topnewtets, *tg_botnewtets;
  arraypool *tg_topfaces, *tg_botfaces, *tg_midfaces;
  arraypool *tg_topshells, *tg_botshells, *tg_facfaces; 
  arraypool *tg_toppoints, *tg_botpoints;
  arraypool *tg_missingshs, *tg_missingshbds, *tg_missingshverts;
  triface searchtet, neightet, crossedge;
  face searchsh, *parysh, *parysh1;
  face *paryseg;
  point *parypt;
  enum interresult dir;
  int facetcount;
  int success;
  int t1ver;
  int i, j;

  // Initialize arrays.
  tg_crosstets      = new arraypool(sizeof(triface), 10);
  tg_topnewtets     = new arraypool(sizeof(triface), 10);
  tg_botnewtets     = new arraypool(sizeof(triface), 10);
  tg_topfaces       = new arraypool(sizeof(triface), 10);
  tg_botfaces       = new arraypool(sizeof(triface), 10);
  tg_midfaces       = new arraypool(sizeof(triface), 10);
  tg_toppoints      = new arraypool(sizeof(point), 8);
  tg_botpoints      = new arraypool(sizeof(point), 8);
  tg_facfaces       = new arraypool(sizeof(face), 10);
  tg_topshells      = new arraypool(sizeof(face), 10);
  tg_botshells      = new arraypool(sizeof(face), 10);
  tg_missingshs     = new arraypool(sizeof(face), 10);
  tg_missingshbds   = new arraypool(sizeof(face), 10);
  tg_missingshverts = new arraypool(sizeof(point), 8);
  // This is a global array used by refineregion().
  encseglist        = new arraypool(sizeof(face), 4);

  facetcount = 0;

  while (subfacstack->objects > 0l) {

    subfacstack->objects--;
    parysh = (face *) fastlookup(subfacstack, subfacstack->objects);
    searchsh = *parysh;

    if (searchsh.sh[3] == NULL) continue; // It is dead.
    if (isshtet(searchsh)) continue; // It is recovered.

    // Collect all unrecovered subfaces which are co-facet.
    smarktest(searchsh);
    tg_facfaces->newindex((void **) &parysh);
    *parysh = searchsh;
    for (i = 0; i < tg_facfaces->objects; i++) {
      parysh = (face *) fastlookup(tg_facfaces, i);
      for (j = 0; j < 3; j++) {
        if (!isshsubseg(*parysh)) {
          spivot(*parysh, searchsh);
          if (!smarktested(searchsh)) {
            if (!isshtet(searchsh)) {
              smarktest(searchsh);
              tg_facfaces->newindex((void **) &parysh1);
              *parysh1 = searchsh;
            }
          }
        }
        senextself(*parysh);
      } // j
    } // i
    // Have found all facet subfaces. Unmark them.
    for (i = 0; i < tg_facfaces->objects; i++) {
      parysh = (face *) fastlookup(tg_facfaces, i);
      sunmarktest(*parysh);
    }

    if (b->verbose > 1) {
      printf("    Recovering facet #%d: %ld subfaces.\n", facetcount + 1, 
             tg_facfaces->objects);
    }
    facetcount++;

    while (tg_facfaces->objects > 0l) {

      tg_facfaces->objects--;
      parysh = (face *) fastlookup(tg_facfaces, tg_facfaces->objects);
      searchsh = *parysh;

      if (searchsh.sh[3] == NULL) continue; // It is dead.
      if (isshtet(searchsh)) continue; // It is recovered.

      searchtet.tet = NULL;
      if (scoutsubface(&searchsh, &searchtet, 1)) continue;

      // The subface is missing. Form the missing region.
      //   Re-use 'tg_crosstets' for 'adjtets'.
      formregion(&searchsh, tg_missingshs, tg_missingshbds, tg_missingshverts);

      if (scoutcrossedge(searchtet, tg_missingshbds, tg_missingshs)) {
        // Save this crossing edge, will be used by fillcavity().
        crossedge = searchtet;
        // Form a cavity of crossing tets.
        success = formcavity(&searchtet, tg_missingshs, tg_crosstets,
                             tg_topfaces, tg_botfaces, tg_toppoints,
                             tg_botpoints);
        if (success) {
          if (!b->flipinsert) {
            // Tetrahedralize the top part. Re-use 'tg_midfaces'.
            delaunizecavity(tg_toppoints, tg_topfaces, tg_topshells,
                            tg_topnewtets, tg_crosstets, tg_midfaces);
            // Tetrahedralize the bottom part. Re-use 'tg_midfaces'.
            delaunizecavity(tg_botpoints, tg_botfaces, tg_botshells,
                            tg_botnewtets, tg_crosstets, tg_midfaces);
            // Fill the cavity with new tets.
            success = fillcavity(tg_topshells, tg_botshells, tg_midfaces,
                                 tg_missingshs, tg_topnewtets, tg_botnewtets,
                                 &crossedge);
            if (success) {
              // Cavity is remeshed. Delete old tets and outer new tets.
              carvecavity(tg_crosstets, tg_topnewtets, tg_botnewtets);
            } else {
              restorecavity(tg_crosstets, tg_topnewtets, tg_botnewtets,
                            tg_missingshbds);
            }
          } else {
            // Use the flip algorithm of Shewchuk to recover the subfaces.
            flipinsertfacet(tg_crosstets, tg_toppoints, tg_botpoints, 
                            tg_missingshverts);
			// Put all subfaces in R back to tg_facfaces.
		    for (i = 0; i < tg_missingshs->objects; i++) {
		      parysh = (face *) fastlookup(tg_missingshs, i);
		      tg_facfaces->newindex((void **) &parysh1);
              *parysh1 = *parysh;
		    }
			success = 1;
            // Clear working lists.
            tg_crosstets->restart();
            tg_topfaces->restart();
            tg_botfaces->restart();
            tg_toppoints->restart();
            tg_botpoints->restart();
          } // b->flipinsert

          if (success) {
            // Recover interior subfaces.
            for (i = 0; i < caveencshlist->objects; i++) {
              parysh = (face *) fastlookup(caveencshlist, i);
              if (!scoutsubface(parysh, &searchtet, 1)) {
                // Add this face at the end of the list, so it will be
                //   processed immediately.
                tg_facfaces->newindex((void **) &parysh1);
                *parysh1 = *parysh;
              }
            }
            caveencshlist->restart();
            // Recover interior segments. This should always be recovered.
            for (i = 0; i < caveencseglist->objects; i++) {
              paryseg = (face *) fastlookup(caveencseglist, i);
              dir = scoutsegment(sorg(*paryseg), sdest(*paryseg), paryseg,
                                 &searchtet, NULL, NULL);
              if (dir != SHAREEDGE) {
                terminatetetgen(this, 2);
              }
              // Insert this segment.
              // Let the segment remember an adjacent tet.
              sstbond1(*paryseg, searchtet);
              // Bond the segment to all tets containing it.
              neightet = searchtet;
              do {
                tssbond1(neightet, *paryseg);
                fnextself(neightet);
              } while (neightet.tet != searchtet.tet);
            }
            caveencseglist->restart();
          } // success - remesh cavity
        } // success - form cavity
      } else {
        // Put all subfaces in R back to tg_facfaces.
		for (i = 0; i < tg_missingshs->objects; i++) {
		  parysh = (face *) fastlookup(tg_missingshs, i);
		  tg_facfaces->newindex((void **) &parysh1);
          *parysh1 = *parysh;
		}
		success = 1;
      } // if (scoutcrossedge)

      // Unmarktest all points of the missing region.
      for (i = 0; i < tg_missingshverts->objects; i++) {
        parypt = (point *) fastlookup(tg_missingshverts, i);
        punmarktest(*parypt);
      }
      tg_missingshverts->restart();
      tg_missingshbds->restart();
      tg_missingshs->restart();

      if (!success) {
        // The missing region can not be recovered. Refine it.
        refineregion(recentsh, tg_toppoints, tg_topfaces, tg_topshells,
                     tg_topnewtets, tg_crosstets, tg_midfaces);
      }
    } // while (tg_facfaces->objects)

  } // while ((subfacstack->objects)

  // Accumulate the dynamic memory.
  totalworkmemory += (tg_crosstets->totalmemory + tg_topnewtets->totalmemory +
                      tg_botnewtets->totalmemory + tg_topfaces->totalmemory +
                      tg_botfaces->totalmemory + tg_midfaces->totalmemory +
                      tg_toppoints->totalmemory + tg_botpoints->totalmemory +
                      tg_facfaces->totalmemory + tg_topshells->totalmemory +
                      tg_botshells->totalmemory + tg_missingshs->totalmemory +
                      tg_missingshbds->totalmemory + 
                      tg_missingshverts->totalmemory + 
                      encseglist->totalmemory);

  // Delete arrays.
  delete tg_crosstets;
  delete tg_topnewtets;
  delete tg_botnewtets;
  delete tg_topfaces;
  delete tg_botfaces;
  delete tg_midfaces;
  delete tg_toppoints;
  delete tg_botpoints;
  delete tg_facfaces;
  delete tg_topshells;
  delete tg_botshells;
  delete tg_missingshs;
  delete tg_missingshbds;
  delete tg_missingshverts;
  delete encseglist;
  encseglist = NULL;
}